

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O3

void memRev(void *buf,size_t count)

{
  long lVar1;
  byte *pbVar2;
  byte bVar3;
  
  if (1 < count) {
    pbVar2 = (byte *)((count >> 1) + (long)buf);
    lVar1 = -(count >> 1);
    do {
      pbVar2 = pbVar2 + -1;
      bVar3 = *pbVar2 ^ *(byte *)((long)buf + lVar1 + count);
      *pbVar2 = bVar3;
      bVar3 = bVar3 ^ *(byte *)((long)buf + lVar1 + count);
      *(byte *)((long)buf + lVar1 + count) = bVar3;
      *pbVar2 = *pbVar2 ^ bVar3;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0);
  }
  return;
}

Assistant:

void memRev(void* buf, size_t count)
{
	register size_t i = count / 2;
	ASSERT(memIsValid(buf, count));
	while (i--)
	{
		((octet*)buf)[i] ^= ((octet*)buf)[count - 1 - i];
		((octet*)buf)[count - 1 - i] ^= ((octet*)buf)[i];
		((octet*)buf)[i] ^= ((octet*)buf)[count - 1 - i];
	}
}